

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O3

DetectorResult *
ZXing::QRCode::DetectPureQR(DetectorResult *__return_storage_ptr__,BitMatrix *image)

{
  PointT<int> PVar1;
  double dVar2;
  ConcentricPattern a;
  ConcentricPattern b;
  DetectorResult *pDVar3;
  ulong uVar4;
  bool bVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  float left_00;
  float subSampling;
  float fVar10;
  float fVar11;
  int width;
  int top;
  int left;
  int height;
  int local_f8;
  uint local_f4;
  uint local_f0;
  int local_ec;
  _Type local_e8;
  DetectorResult *local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  double local_b0;
  double dStack_a8;
  uint local_a0;
  undefined4 uStack_9c;
  double local_98;
  double dStack_90;
  uint local_88;
  undefined4 uStack_84;
  PatternView local_80;
  BitMatrix local_60;
  undefined8 local_40;
  undefined8 local_38;
  
  bVar5 = BitMatrix::findBoundingBox
                    (image,(int *)&local_f0,(int *)&local_f4,&local_f8,&local_ec,0x15);
  local_d8 = __return_storage_ptr__;
  if (bVar5) {
    uVar7 = local_f8 - local_ec;
    uVar8 = -uVar7;
    if (0 < (int)uVar7) {
      uVar8 = uVar7;
    }
    if (uVar8 < 2) {
      local_c0 = (ulong)local_f0;
      uVar8 = (local_f8 + local_f0) - 1;
      local_b8 = (ulong)uVar8;
      local_c8 = (ulong)local_f4;
      uVar7 = (local_ec + local_f4) - 1;
      local_60._height = local_f4;
      local_60._width = local_f0;
      local_60._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x100000001;
      local_60._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(local_f4,uVar8);
      local_60._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x1ffffffff;
      local_d0 = (ulong)uVar7 << 0x20;
      local_40 = CONCAT44(uVar7,local_f0);
      local_38 = 0xffffffff00000001;
      lVar9 = 0;
      do {
        local_80._8_8_ = *(undefined8 *)((long)&local_60._width + lVar9);
        local_80._base =
             *(Iterator *)
              ((long)&local_60._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar9);
        local_80._data = (Iterator)image;
        local_e8 = (_Type)BitMatrixCursor<ZXing::PointT<int>>::
                          readPatternFromBlack<std::array<unsigned_short,5ul>>
                                    ((BitMatrixCursor<ZXing::PointT<int>> *)&local_80,1,
                                     local_f8 / 3 + 1);
        local_80._size = 5;
        local_80._base = (Iterator)0x0;
        local_80._end = (Iterator)0x0;
        local_80._data = local_e8;
        dVar2 = IsPattern<false,5,7>(&local_80,(FixedPattern<5,_7,_false> *)PATTERN,0,0.0,0.0);
        uVar4 = local_b8;
        if ((dVar2 == 0.0) && (!NAN(dVar2))) goto LAB_0018683d;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x30);
      lVar9 = 0;
      uVar6 = 0;
      do {
        uVar6 = uVar6 + *(short *)((long)local_e8 + lVar9);
        lVar9 = lVar9 + 2;
      } while (lVar9 != 10);
      local_88 = (uint)uVar6;
      local_b0 = (double)(uVar6 >> 1);
      local_98 = (double)(int)local_c0 + local_b0;
      dStack_a8 = (double)(int)local_c8 + local_b0;
      local_b0 = (double)(int)local_b8 - local_b0;
      local_a0 = (uint)uVar6;
      b._20_4_ = uStack_9c;
      b.size = local_a0;
      a._20_4_ = uStack_84;
      a.size = local_88;
      a.super_PointF.y = dStack_a8;
      a.super_PointF.x = local_98;
      b.super_PointF.y = dStack_a8;
      b.super_PointF.x = local_b0;
      dStack_90 = dStack_a8;
      EstimateDimension((DimensionEstimate *)&local_60,image,a,b);
      pDVar3 = local_d8;
      if ((local_60._width & 3U) == 1 && local_60._width - 0x15U < 0x9d) {
        subSampling = (float)local_f8 / (float)local_60._width;
        left_00 = (float)(int)local_f0 + subSampling * 0.5;
        fVar10 = (float)(int)(local_60._width - 1) * subSampling;
        fVar11 = fVar10 + left_00;
        if ((0.0 <= fVar11) && (fVar11 < (float)image->_width)) {
          fVar11 = subSampling * 0.5 + (float)(int)local_f4;
          fVar10 = fVar10 + fVar11;
          if ((0.0 <= fVar10) && (fVar10 < (float)image->_height)) {
            Deflate(&local_60,image,local_60._width,local_60._width,fVar11,left_00,subSampling);
            PVar1.y = local_f4;
            PVar1.x = local_f0;
            (pDVar3->_bits)._width = local_60._width;
            (pDVar3->_bits)._height = local_60._height;
            (pDVar3->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 local_60._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (pDVar3->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_60._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (pDVar3->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_60._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            (pDVar3->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = PVar1;
            (pDVar3->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1] =
                 (PointT<int>)((ulong)local_f4 << 0x20 | uVar4);
            (pDVar3->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2] =
                 (PointT<int>)(uVar4 | local_d0);
            (pDVar3->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
                 (PointT<int>)(local_d0 | local_f0);
            return pDVar3;
          }
        }
      }
    }
  }
LAB_0018683d:
  (local_d8->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  (local_d8->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  (local_d8->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  (local_d8->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  (local_d8->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  (local_d8->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  (local_d8->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  (local_d8->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  (local_d8->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_d8->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_d8->_bits)._width = 0;
  (local_d8->_bits)._height = 0;
  (local_d8->_bits)._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return local_d8;
}

Assistant:

DetectorResult DetectPureQR(const BitMatrix& image)
{
	using Pattern = std::array<PatternView::value_type, PATTERN.size()>;

#ifdef PRINT_DEBUG
	SaveAsPBM(image, "weg.pbm");
#endif

	constexpr int MIN_MODULES = Version::SymbolSize(1, Type::Model2).x;

	int left, top, width, height;
	if (!image.findBoundingBox(left, top, width, height, MIN_MODULES) || std::abs(width - height) > 1)
		return {};
	int right  = left + width - 1;
	int bottom = top + height - 1;

	PointI tl{left, top}, tr{right, top}, bl{left, bottom};
	Pattern diagonal;
	// allow corners be moved one pixel inside to accommodate for possible aliasing artifacts
	for (auto [p, d] : {std::pair(tl, PointI{1, 1}), {tr, {-1, 1}}, {bl, {1, -1}}}) {
		diagonal = BitMatrixCursorI(image, p, d).readPatternFromBlack<Pattern>(1, width / 3 + 1);
		if (!IsPattern(diagonal, PATTERN))
			return {};
	}

	auto fpWidth = Reduce(diagonal);
	auto dimension =
		EstimateDimension(image, {tl + fpWidth / 2 * PointF(1, 1), fpWidth}, {tr + fpWidth / 2 * PointF(-1, 1), fpWidth}).dim;

	float moduleSize = float(width) / dimension;
	if (!Version::IsValidSize({dimension, dimension}, Type::Model2) ||
		!image.isIn(PointF{left + moduleSize / 2 + (dimension - 1) * moduleSize,
						   top + moduleSize / 2 + (dimension - 1) * moduleSize}))
		return {};

#ifdef PRINT_DEBUG
	LogMatrix log;
	LogMatrixWriter lmw(log, image, 5, "grid2.pnm");
	for (int y = 0; y < dimension; y++)
		for (int x = 0; x < dimension; x++)
			log(PointF(left + (x + .5f) * moduleSize, top + (y + .5f) * moduleSize));
#endif

	// Now just read off the bits (this is a crop + subsample)
	return {Deflate(image, dimension, dimension, top + moduleSize / 2, left + moduleSize / 2, moduleSize),
			{{left, top}, {right, top}, {right, bottom}, {left, bottom}}};
}